

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O3

int main(int argc,char **argv)

{
  double x;
  ALLEGRO_COLOR c1;
  ALLEGRO_COLOR c1_00;
  ALLEGRO_COLOR c1_01;
  ALLEGRO_COLOR c1_02;
  ALLEGRO_COLOR c2;
  ALLEGRO_COLOR c2_00;
  ALLEGRO_COLOR c2_01;
  ALLEGRO_COLOR c2_02;
  ALLEGRO_COLOR c2_03;
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  int extraout_EAX;
  long lVar12;
  undefined8 uVar13;
  Camera *pCVar14;
  undefined8 uVar15;
  long lVar16;
  undefined8 *puVar17;
  int iVar18;
  int iVar19;
  Camera *pCVar20;
  char *pcVar21;
  float fVar22;
  double dVar23;
  double x_00;
  double extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  double dVar24;
  double x_01;
  double y;
  float fVar25;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  float fVar26;
  double z;
  double z_00;
  double z_01;
  float fVar27;
  float fVar28;
  double dVar29;
  double dVar30;
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR color_00;
  ALLEGRO_COLOR color_01;
  ALLEGRO_COLOR color_02;
  ALLEGRO_COLOR color_03;
  ALLEGRO_COLOR color_04;
  ALLEGRO_COLOR color_05;
  ALLEGRO_COLOR color_06;
  Vector axis;
  Vector axis_00;
  Vector axis_01;
  Vector axis_02;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ALLEGRO_COLOR AVar34;
  ALLEGRO_EVENT event;
  ALLEGRO_TRANSFORM projection;
  ALLEGRO_TRANSFORM t;
  ulong uVar35;
  double in_stack_fffffffffffffd70;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 local_228;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  double local_218;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_188;
  float fStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  float local_178;
  float fStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  int local_100 [8];
  int local_e0;
  undefined8 local_d0;
  uint local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_70 [64];
  
  if (argc < 2) {
    pcVar21 = (char *)0x0;
  }
  else {
    pcVar21 = argv[1];
  }
  cVar9 = al_install_system(0x5020700,atexit);
  if (cVar9 == '\0') {
    pcVar21 = "Could not init Allegro.\n";
  }
  else {
    al_init_font_addon();
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_set_new_display_option(0x11,1,2);
    al_set_new_display_option(0x12,8,2);
    al_set_new_display_option(0xf,0x10,2);
    al_set_new_display_flags(0x10);
    lVar12 = al_create_display(0x280,0x168);
    if (lVar12 != 0) {
      if (pcVar21 != (char *)0x0) {
        al_init_image_addon();
        ex.skybox = (ALLEGRO_BITMAP *)al_load_bitmap(pcVar21);
        if (ex.skybox == (ALLEGRO_BITMAP *)0x0) {
          printf("Failed loading skybox %s\n",pcVar21);
        }
        else {
          uVar10 = al_get_bitmap_width(ex.skybox);
          uVar11 = al_get_bitmap_height(ex.skybox);
          printf("Loaded skybox %s: %d x %d\n",pcVar21,(ulong)uVar10,(ulong)uVar11);
        }
      }
      uVar13 = al_create_timer(0x3f91111111111111);
      pCVar14 = (Camera *)al_create_event_queue();
      uVar15 = al_get_keyboard_event_source();
      al_register_event_source(pCVar14,uVar15);
      uVar15 = al_get_mouse_event_source();
      al_register_event_source(pCVar14,uVar15);
      uVar15 = al_get_display_event_source(lVar12);
      al_register_event_source(pCVar14,uVar15);
      uVar15 = al_get_timer_event_source(uVar13);
      al_register_event_source(pCVar14,uVar15);
      ex.camera.xaxis.x = 1.0;
      ex.camera.yaxis.y = 1.0;
      ex.camera.zaxis.z = 1.0;
      ex.camera.position.y = 2.0;
      ex.camera.vertical_field_of_view = 1.0471975511965976;
      ex.mouse_look_speed = 0.03;
      ex.movement_speed = 0.05;
      ex.controls_names[0] = "FPS";
      ex.controls_names[1] = "airplane";
      ex.controls_names[2] = "spaceship";
      ex.font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_start_timer(uVar13);
LAB_001027ae:
      bVar1 = false;
LAB_001027b0:
      pCVar20 = pCVar14;
      al_wait_for_event(pCVar14,local_100);
      iVar8 = ex.key[0x55];
      iVar7 = ex.key[0x54];
      iVar6 = ex.key[0x53];
      iVar5 = ex.key[0x52];
      iVar4 = ex.key[0x17];
      iVar3 = ex.key[0x13];
      iVar19 = ex.key[4];
      iVar18 = ex.key[1];
      if (local_100[0] < 0x16) {
        if (local_100[0] < 0x14) {
          if (local_100[0] == 10) {
            lVar16 = (long)local_e0;
            if (lVar16 == 0x4b) {
              ex.controls = ex.controls + ((ex.controls + 1) / 3) * -3 + 1;
            }
            else if (local_e0 == 0x3b) {
              return 0;
            }
            ex.key[lVar16] = 1;
            ex.keystate[lVar16] = 1;
          }
          else if (local_100[0] == 0xc) {
            ex.keystate[local_e0] = 0;
          }
        }
        else if (local_100[0] == 0x14) {
          ex.mouse_dx = ex.mouse_dx + (int)local_d0;
          ex.mouse_dy = ex.mouse_dy + (int)((ulong)local_d0 >> 0x20);
        }
        else if (local_100[0] == 0x15) {
          ex.button[local_c0] = 1;
        }
LAB_00102b73:
        if (!bVar1) goto LAB_001027ae;
      }
      else {
        if (0x28 < local_100[0]) {
          if (local_100[0] == 0x29) {
            al_acknowledge_resize(lVar12);
          }
          else if (local_100[0] == 0x2a) {
            return 0;
          }
          goto LAB_00102b73;
        }
        if (local_100[0] == 0x16) {
          ex.button[local_c0] = 0;
          goto LAB_00102b73;
        }
        if (local_100[0] != 0x1e) goto LAB_00102b73;
        if (ex.key[0x1a] != 0) {
          dVar29 = ex.camera.vertical_field_of_view + -0.01;
          ex.camera.vertical_field_of_view = 0.3490658503988659;
          if (0.3490658503988659 <= dVar29) {
            ex.camera.vertical_field_of_view = dVar29;
          }
        }
        if (ex.key[0x18] != 0) {
          dVar29 = ex.camera.vertical_field_of_view + 0.01;
          ex.camera.vertical_field_of_view = 2.0943951023931953;
          if (dVar29 <= 2.0943951023931953) {
            ex.camera.vertical_field_of_view = dVar29;
          }
        }
        if (ex.controls == 0) {
          fVar25 = ex.camera.position.y;
          if (2.0 < ex.camera.position.y) {
            fVar25 = ex.camera.position.y + -0.1;
            ex.camera.position.y = fVar25;
          }
          if (fVar25 < 2.0) {
            ex.camera.position.y = 2.0;
          }
LAB_001029d6:
          dVar29 = get_roll(pCVar20);
          axis.y = ex.camera.zaxis.y;
          axis.x = ex.camera.zaxis.x;
          axis.z = ex.camera.zaxis.z;
          camera_rotate_around_axis(pCVar20,axis,dVar29 / 60.0);
        }
        else if ((ex.controls & 0xfffffffdU) == 0) goto LAB_001029d6;
        auVar33._0_4_ = -(uint)(iVar5 == 0 && iVar18 == 0);
        auVar33._4_4_ = -(uint)(iVar5 == 0 && iVar18 == 0);
        auVar33._8_4_ = -(uint)(iVar8 == 0 && iVar3 == 0);
        auVar33._12_4_ = -(uint)(iVar8 == 0 && iVar3 == 0);
        auVar31._0_4_ = -(uint)(iVar6 == 0 && iVar19 == 0);
        auVar31._4_4_ = -(uint)(iVar6 == 0 && iVar19 == 0);
        auVar31._8_4_ = -(uint)(iVar7 == 0 && iVar4 == 0);
        auVar31._12_4_ = -(uint)(iVar7 == 0 && iVar4 == 0);
        auVar31 = ~auVar31 & _DAT_001050c0 | ~auVar33 & _DAT_001050b0 & auVar31;
        auVar32._0_8_ = SQRT(auVar31._0_8_ * auVar31._0_8_ + auVar31._8_8_ * auVar31._8_8_);
        if (0.0 < auVar32._0_8_) {
          auVar32._8_8_ = auVar32._0_8_;
          auVar31 = divpd(auVar31,auVar32);
          if (ex.controls == 0) {
            fVar26 = -ex.camera.zaxis.x;
            fVar22 = -ex.camera.zaxis.z;
            fVar25 = SQRT(ex.camera.zaxis.z * ex.camera.zaxis.z +
                          ex.camera.zaxis.x * ex.camera.zaxis.x + 0.0);
            if ((fVar25 != 0.0) || (NAN(fVar25))) {
              fVar22 = fVar22 * (1.0 / fVar25);
              fVar26 = (1.0 / fVar25) * fVar26;
            }
            fVar25 = SQRT(ex.camera.xaxis.z * ex.camera.xaxis.z +
                          ex.camera.xaxis.x * ex.camera.xaxis.x + 0.0);
            if ((fVar25 != 0.0) ||
               (fVar27 = ex.camera.xaxis.z, fVar28 = ex.camera.xaxis.x, NAN(fVar25))) {
              fVar27 = ex.camera.xaxis.z * (1.0 / fVar25);
              fVar28 = ex.camera.xaxis.x * (1.0 / fVar25);
            }
            dVar29 = auVar31._0_8_ * ex.movement_speed;
            dVar23 = auVar31._8_8_ * ex.movement_speed;
            ex.camera.position.x =
                 (float)((double)ex.camera.position.x +
                        (double)fVar26 * dVar23 + (double)fVar28 * dVar29);
            ex.camera.position.z =
                 (float)((double)ex.camera.position.z +
                        (double)fVar22 * dVar23 + (double)fVar27 * dVar29);
          }
          else if ((uint)ex.controls < 3) {
            fVar25 = (float)(auVar31._0_8_ * ex.movement_speed);
            fVar22 = (float)(auVar31._8_8_ * ex.movement_speed);
            ex.camera.position.y =
                 (fVar25 * ex.camera.xaxis.y + ex.camera.position.y) - fVar22 * ex.camera.zaxis.y;
            ex.camera.position.x =
                 (fVar25 * ex.camera.xaxis.x + ex.camera.position.x) - fVar22 * ex.camera.zaxis.x;
            ex.camera.position.z =
                 (ex.camera.position.z + ex.camera.xaxis.z * fVar25) - ex.camera.zaxis.z * fVar22;
          }
        }
        if (ex.button[1] != 0) {
          if ((ex.controls & 0xfffffffdU) == 0) {
            axis_00.y = ex.camera.xaxis.y;
            axis_00.x = ex.camera.xaxis.x;
            axis_00.z = ex.camera.xaxis.z;
            camera_rotate_around_axis(pCVar20,axis_00,(double)ex.mouse_dy * -ex.mouse_look_speed);
            camera_rotate_around_axis
                      (pCVar20,(Vector)ZEXT812(0x3f80000000000000),
                       (double)ex.mouse_dx * -ex.mouse_look_speed);
          }
          if (ex.controls == 1) {
            axis_01.y = ex.camera.xaxis.y;
            axis_01.x = ex.camera.xaxis.x;
            axis_01.z = ex.camera.xaxis.z;
            camera_rotate_around_axis(pCVar20,axis_01,(double)ex.mouse_dy * -ex.mouse_look_speed);
            axis_02.y = ex.camera.zaxis.y;
            axis_02.x = ex.camera.zaxis.x;
            axis_02.z = ex.camera.zaxis.z;
            camera_rotate_around_axis(pCVar20,axis_02,(double)ex.mouse_dx * -ex.mouse_look_speed);
          }
        }
        lVar16 = -0xe3;
        do {
          if (*(int *)((long)ex.controls_names + lVar16 * 4 + -0x10) == 0) {
            ex.keystate[lVar16] = 0;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
        ex.mouse_dx = 0;
        ex.mouse_dy = 0;
      }
      cVar9 = al_is_event_queue_empty(pCVar14);
      bVar1 = true;
      if (cVar9 != '\0') {
        puVar17 = (undefined8 *)al_get_current_projection_transform();
        local_b8 = *puVar17;
        uStack_b0 = puVar17[1];
        local_a8 = puVar17[2];
        uStack_a0 = puVar17[3];
        local_98 = puVar17[4];
        uStack_90 = puVar17[5];
        local_88 = *(undefined4 *)(puVar17 + 6);
        uStack_84 = *(undefined4 *)((long)puVar17 + 0x34);
        uStack_80 = *(undefined4 *)(puVar17 + 7);
        uStack_7c = *(undefined4 *)((long)puVar17 + 0x3c);
        al_color_name("black");
        auVar31 = al_color_name("white");
        uVar13 = al_get_current_display();
        al_get_display_width(uVar13);
        al_get_display_height(uVar13);
        al_identity_transform(local_70);
        al_translate_transform_3d(0,local_70);
        tan(ex.camera.vertical_field_of_view * 0.5);
        al_perspective_transform(local_70);
        al_use_projection_transform(local_70);
        al_clear_to_color();
        al_set_render_state(0x12,1);
        al_clear_depth_buffer();
        ex.n = 0;
        auVar32 = al_color_name("yellow");
        auVar33 = al_color_name("green");
        iVar18 = 0;
        do {
          iVar19 = -10;
          do {
            if ((iVar18 + iVar19 & 1U) == 0) {
              uVar41 = auVar32._8_4_;
              fVar22 = auVar32._12_4_;
              uVar38 = auVar32._0_4_;
              fVar25 = auVar32._4_4_;
              uVar39 = SUB84(extraout_XMM0_Qb,0);
              uVar40 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
              uVar36 = (undefined4)extraout_XMM1_Qb;
              uVar37 = (undefined4)((ulong)extraout_XMM1_Qb >> 0x20);
              dVar23 = 0.2;
              dVar29 = extraout_XMM0_Qb;
              auVar2 = auVar32;
            }
            else {
              uVar41 = auVar33._8_4_;
              fVar22 = auVar33._12_4_;
              uVar38 = auVar33._0_4_;
              fVar25 = auVar33._4_4_;
              uVar39 = SUB84(extraout_XMM0_Qb_00,0);
              uVar40 = (undefined4)((ulong)extraout_XMM0_Qb_00 >> 0x20);
              uVar36 = (undefined4)extraout_XMM1_Qb_00;
              uVar37 = (undefined4)((ulong)extraout_XMM1_Qb_00 >> 0x20);
              dVar23 = 0.1;
              dVar29 = extraout_XMM0_Qb_00;
              auVar2 = auVar33;
            }
            AVar34.g = (float)uVar37;
            AVar34.r = (float)uVar36;
            AVar34.b = (float)uVar38;
            AVar34.a = fVar25;
            c2.g = (float)uVar40;
            c2.r = (float)uVar39;
            c2.b = (float)uVar41;
            c2.a = fVar22;
            add_quad((double)iVar19,dVar23,(double)(iVar18 + -10),0.0,0.0,1.0,0.0,0.0,0.0,1.0,0.0,
                     in_stack_fffffffffffffd70,auVar2._0_8_,dVar29,auVar2._8_8_,AVar34,c2);
            fVar25 = ex.camera.position.z;
            iVar19 = iVar19 + 1;
          } while (iVar19 != 10);
          iVar18 = iVar18 + 1;
        } while (iVar18 != 0x14);
        fVar22 = ex.camera.position.x;
        fVar26 = ex.camera.position.y;
        auVar32 = al_color_name("black");
        auVar33 = al_color_name("blue");
        AVar34 = (ALLEGRO_COLOR)al_color_name("white");
        uStack_1e0._4_4_ = (undefined4)((ulong)extraout_XMM1_Qb_01 >> 0x20);
        if (ex.skybox == (ALLEGRO_BITMAP *)0x0) {
          local_218 = 0.0;
          dVar29 = 0.0;
          local_238._0_4_ = auVar33._8_4_;
          local_238._4_4_ = auVar33._12_4_;
          local_228._0_4_ = auVar33._0_4_;
          local_228._4_4_ = auVar33._4_4_;
          uStack_220 = (undefined4)extraout_XMM0_Qb_02;
          uStack_21c = (undefined4)((ulong)extraout_XMM0_Qb_02 >> 0x20);
          local_248._0_4_ = auVar32._0_4_;
          local_248._4_4_ = auVar32._4_4_;
          uStack_240._0_4_ = (undefined4)extraout_XMM0_Qb_01;
          uStack_240._4_4_ = (undefined4)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          local_1e8._0_4_ = auVar32._8_4_;
          local_1e8._4_4_ = auVar32._12_4_;
          uStack_1e0._0_4_ = (undefined4)extraout_XMM1_Qb_01;
          local_188 = (float)local_228;
          fStack_184 = local_228._4_4_;
          uStack_180 = uStack_220;
          uStack_17c = uStack_21c;
          local_178 = (float)local_238;
          fStack_174 = local_238._4_4_;
          uStack_170 = (undefined4)uStack_1e0;
          uStack_16c = uStack_1e0._4_4_;
        }
        else {
          iVar18 = al_get_bitmap_width();
          local_218 = (double)iVar18 * 0.25;
          iVar18 = al_get_bitmap_height(ex.skybox);
          dVar29 = (double)iVar18 / 3.0;
          local_178 = AVar34.b;
          fStack_174 = AVar34.a;
          uStack_170 = (undefined4)extraout_XMM1_Qb_02;
          uStack_16c = (undefined4)((ulong)extraout_XMM1_Qb_02 >> 0x20);
          local_188 = AVar34.r;
          fStack_184 = AVar34.g;
          uStack_180 = (undefined4)extraout_XMM0_Qb_03;
          uStack_17c = (undefined4)((ulong)extraout_XMM0_Qb_03 >> 0x20);
          local_248._0_4_ = local_188;
          local_248._4_4_ = fStack_184;
          uStack_240._0_4_ = uStack_180;
          uStack_240._4_4_ = uStack_17c;
          local_1e8._0_4_ = local_178;
          local_1e8._4_4_ = fStack_174;
        }
        uStack_1e0._0_4_ = uStack_170;
        uStack_1e0._4_4_ = uStack_16c;
        x = (double)(fVar22 + -50.0);
        dVar24 = (double)(fVar26 + -50.0);
        z = (double)(fVar25 + -50.0);
        dVar23 = dVar29 + dVar29;
        dVar30 = -dVar29;
        c1.g = (float)uStack_16c;
        c1.r = (float)uStack_170;
        c1.b = local_188;
        c1.a = fStack_184;
        c2_00.g = (float)uStack_17c;
        c2_00.r = (float)uStack_180;
        c2_00.b = local_178;
        c2_00.a = fStack_174;
        add_quad(x,dVar24,z,local_218 * 4.0,dVar23,100.0,0.0,-local_218,100.0,0.0,dVar30,
                 in_stack_fffffffffffffd70,(double)CONCAT44(local_248._4_4_,(float)local_248),
                 (double)CONCAT44(uStack_240._4_4_,(undefined4)uStack_240),
                 (double)CONCAT44(local_1e8._4_4_,(float)local_1e8),c1,c2_00);
        z_00 = (double)(fVar25 + 50.0);
        c1_00.b = local_188;
        c1_00.r = (float)(undefined4)uStack_1e0;
        c1_00.g = (float)uStack_1e0._4_4_;
        c1_00.a = fStack_184;
        c2_01.g = (float)uStack_17c;
        c2_01.r = (float)uStack_180;
        c2_01.b = local_178;
        c2_01.a = fStack_174;
        add_quad(x,dVar24,z_00,local_218,dVar23,100.0,0.0,local_218,100.0,0.0,dVar30,
                 in_stack_fffffffffffffd70,local_248,uStack_240,local_1e8,c1_00,c2_01);
        c1_01.b = local_188;
        c1_01.r = (float)(undefined4)uStack_1e0;
        c1_01.g = (float)uStack_1e0._4_4_;
        c1_01.a = fStack_184;
        c2_02.g = (float)uStack_17c;
        c2_02.r = (float)uStack_180;
        c2_02.b = local_178;
        c2_02.a = fStack_174;
        add_quad(x,dVar24,z,0.0,dVar23,0.0,100.0,local_218,100.0,0.0,dVar30,
                 in_stack_fffffffffffffd70,local_248,uStack_240,local_1e8,c1_01,c2_02);
        x_01 = (double)(fVar22 + 50.0);
        c1_02.b = local_188;
        c1_02.r = (float)(undefined4)uStack_1e0;
        c1_02.g = (float)uStack_1e0._4_4_;
        c1_02.a = fStack_184;
        c2_03.g = (float)uStack_17c;
        c2_03.r = (float)uStack_180;
        c2_03.b = local_178;
        c2_03.a = fStack_174;
        add_quad(x_01,dVar24,z,local_218 * 3.0,dVar23,0.0,100.0,-local_218,100.0,0.0,dVar30,
                 in_stack_fffffffffffffd70,local_248,uStack_240,local_1e8,c1_02,c2_03);
        y = (double)(fVar26 + 50.0);
        color.b = local_178;
        color.a = fStack_174;
        color.r = local_188;
        color.g = fStack_184;
        add_vertex(x,y,z,local_218,0.0,color);
        dVar30 = local_218 + local_218;
        color_00.b = local_178;
        color_00.a = fStack_174;
        color_00.r = local_188;
        color_00.g = fStack_184;
        add_vertex(x_01,y,z,dVar30,0.0,color_00);
        x_00 = (double)fVar22;
        z_01 = (double)fVar25;
        dVar23 = local_218 * 1.5;
        dVar24 = dVar29 * 0.5;
        add_vertex(x_00,y,z_01,dVar23,dVar24,AVar34);
        color_01.b = local_178;
        color_01.a = fStack_174;
        color_01.r = local_188;
        color_01.g = fStack_184;
        add_vertex(x_01,y,z,dVar30,0.0,color_01);
        color_02.b = local_178;
        color_02.a = fStack_174;
        color_02.r = local_188;
        color_02.g = fStack_184;
        add_vertex(x_01,y,z_00,dVar30,dVar29,color_02);
        add_vertex(x_00,y,z_01,dVar23,dVar24,AVar34);
        color_03.b = local_178;
        color_03.a = fStack_174;
        color_03.r = local_188;
        color_03.g = fStack_184;
        add_vertex(x_01,y,z_00,dVar30,dVar29,color_03);
        color_04.b = local_178;
        color_04.a = fStack_174;
        color_04.r = local_188;
        color_04.g = fStack_184;
        add_vertex(x,y,z_00,local_218,dVar29,color_04);
        add_vertex(x_00,y,z_01,dVar23,dVar24,AVar34);
        color_05.b = local_178;
        color_05.a = fStack_174;
        color_05.r = local_188;
        color_05.g = fStack_184;
        add_vertex(x,y,z_00,local_218,dVar29,color_05);
        color_06.b = local_178;
        color_06.a = fStack_174;
        color_06.r = local_188;
        color_06.g = fStack_184;
        add_vertex(x,y,z,local_218,0.0,color_06);
        add_vertex(x_00,y,z_01,dVar23,dVar24,AVar34);
        uVar35 = (ulong)(uint)ex.camera.yaxis.z;
        al_build_camera_transform(local_70);
        al_use_transform(local_70);
        al_draw_prim(ex.v,0,ex.skybox,0,ex.n,3,uVar35);
        al_identity_transform(local_70);
        al_use_transform(local_70);
        al_use_projection_transform(&local_b8);
        al_set_render_state(0x12);
        al_get_font_line_height(ex.font);
        pCVar20 = (Camera *)ex.font;
        al_draw_textf(ex.font,0,
                      "look: %+3.1f/%+3.1f/%+3.1f (change with left mouse button and drag)");
        fVar26 = -ex.camera.zaxis.x;
        fVar22 = -ex.camera.zaxis.z;
        fVar25 = SQRT(ex.camera.zaxis.z * ex.camera.zaxis.z +
                      ex.camera.zaxis.x * ex.camera.zaxis.x + 0.0);
        if ((fVar25 != 0.0) || (NAN(fVar25))) {
          fVar25 = 1.0 / fVar25;
          fVar22 = fVar22 * fVar25;
          fVar26 = fVar25 * fVar26;
          fVar25 = fVar25 * 0.0;
        }
        else {
          fVar25 = 0.0;
        }
        asin((double)(fVar22 * ex.camera.yaxis.z +
                     fVar26 * ex.camera.yaxis.x + fVar25 * ex.camera.yaxis.y));
        atan2((double)ex.camera.zaxis.x,(double)ex.camera.zaxis.z);
        get_roll(pCVar20);
        bVar1 = false;
        al_draw_textf(ex.font,0,"pitch: %+4.0f yaw: %+4.0f roll: %+4.0f");
        al_draw_textf(ex.font,0,"vertical field of view: %3.1f (change with Z/X)");
        al_draw_textf(ex.font,0,"move with WASD or cursor");
        al_draw_textf(auVar31._0_8_,auVar31._8_8_,ex.font,0,"control style: %s (space to change)");
        al_flip_display();
      }
      goto LAB_001027b0;
    }
    pcVar21 = "Error creating display\n";
  }
  abort_example(pcVar21);
  fVar25 = SQRT(ex.camera.xaxis.z * ex.camera.xaxis.z + ex.camera.xaxis.x * ex.camera.xaxis.x + 0.0)
  ;
  if ((fVar25 != 0.0) || (NAN(fVar25))) {
    fVar25 = 1.0 / fVar25;
    fVar22 = ex.camera.xaxis.x * fVar25;
    fVar26 = fVar25 * 0.0;
    fVar25 = ex.camera.xaxis.z * fVar25;
  }
  else {
    fVar26 = 0.0;
    fVar25 = ex.camera.xaxis.z;
    fVar22 = ex.camera.xaxis.x;
  }
  asin((double)(fVar25 * ex.camera.yaxis.z + fVar22 * ex.camera.yaxis.x + fVar26 * ex.camera.yaxis.y
               ));
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int redraw = 0;
   char const *skybox_name = NULL;

   if (argc > 1) {
      skybox_name = argv[1];
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_font_addon();
   al_init_primitives_addon();
   init_platform_specific();
   al_install_keyboard();
   al_install_mouse();

   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   display = al_create_display(640, 360);
   if (!display) {
      abort_example("Error creating display\n");
   }

   if (skybox_name) {
      al_init_image_addon();
      ex.skybox = al_load_bitmap(skybox_name);
      if (ex.skybox) {
         printf("Loaded skybox %s: %d x %d\n", skybox_name,
            al_get_bitmap_width(ex.skybox),
            al_get_bitmap_height(ex.skybox));
      }
      else {
         printf("Failed loading skybox %s\n", skybox_name);
      }
   }

   timer = al_create_timer(1.0 / 60);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   setup_scene();

   al_start_timer(timer);
   while (true) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
         break;
      else if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(display);
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
            ex.controls++;
            ex.controls %= 3;
         }
         ex.key[event.keyboard.keycode] = 1;
         ex.keystate[event.keyboard.keycode] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_UP) {
         /* In case a key gets pressed and immediately released, we will still
          * have set ex.key so it is not lost.
          */
         ex.keystate[event.keyboard.keycode] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         int i;
         handle_input();
         redraw = 1;

         /* Reset keyboard state for keys not held down anymore. */
         for (i = 0; i < ALLEGRO_KEY_MAX; i++) {
            if (ex.keystate[i] == 0)
               ex.key[i] = 0;
         }
         ex.mouse_dx = 0;
         ex.mouse_dy = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         ex.button[event.mouse.button] = 1;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_UP) {
         ex.button[event.mouse.button] = 0;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_AXES) {
         ex.mouse_dx += event.mouse.dx;
         ex.mouse_dy += event.mouse.dy;
      }

      if (redraw  && al_is_event_queue_empty(queue)) {
         draw_scene();

         al_flip_display();
         redraw = 0;
      }
   }

   return 0;
}